

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_tree.cpp
# Opt level: O0

match_result_t * __thiscall
zmq::radix_tree_t::match(radix_tree_t *this,uchar *key_,size_t key_size_,bool is_lookup_)

{
  uchar uVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  match_result_t *in_RDI;
  byte in_R8B;
  size_t edgecount;
  size_t i;
  node_t next_node;
  size_t prefix_length;
  uchar *prefix;
  size_t parent_edge_index;
  size_t edge_index;
  size_t prefix_byte_index;
  size_t key_byte_index;
  node_t grandparent_node;
  node_t parent_node;
  node_t current_node;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 uVar4;
  undefined1 uVar5;
  match_result_t *this_00;
  ulong local_78;
  node_t local_70;
  ulong local_68;
  uchar *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  node_t local_38;
  node_t local_30;
  node_t local_28;
  byte local_19;
  ulong local_18;
  long local_10;
  
  local_19 = in_R8B & 1;
  this_00 = in_RDI;
  local_18 = in_RCX;
  local_10 = in_RDX;
  if (in_RDX == 0) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","key_",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/radix_tree.cpp"
            ,0xde);
    fflush(_stderr);
    zmq_abort((char *)0x23e3ed);
  }
  local_38._data = (uchar *)*in_RSI;
  local_40 = 0;
  local_48 = 0;
  local_50 = 0;
  local_58 = 0;
  local_30._data = local_38._data;
  local_28._data = local_38._data;
  while( true ) {
    uVar3 = node_t::prefix_length(&local_28);
    uVar5 = true;
    if (uVar3 == 0) {
      uVar3 = node_t::edgecount(&local_28);
      uVar5 = uVar3 != 0;
    }
    if ((bool)uVar5 == false) goto LAB_0023e6c7;
    local_60 = node_t::prefix(&local_28);
    uVar3 = node_t::prefix_length(&local_28);
    local_68 = (ulong)uVar3;
    for (local_48 = 0;
        (uVar4 = local_48 < local_68 && local_40 < local_18,
        local_48 < local_68 && local_40 < local_18 &&
        (local_60[local_48] == *(uchar *)(local_10 + local_40))); local_48 = local_48 + 1) {
      local_40 = local_40 + 1;
    }
    if (((local_19 & 1) != 0) &&
       ((local_48 == local_68 && (uVar3 = node_t::refcount(&local_28), uVar3 != 0)))) break;
    if ((local_48 != local_68) || (local_40 == local_18)) goto LAB_0023e6c7;
    local_70._data = local_28._data;
    local_78 = 0;
    uVar3 = node_t::edgecount(&local_28);
    for (; local_78 < uVar3; local_78 = local_78 + 1) {
      uVar1 = node_t::first_byte_at
                        ((node_t *)in_RDI,CONCAT17(uVar5,CONCAT16(uVar4,in_stack_ffffffffffffff38)))
      ;
      if (uVar1 == *(uchar *)(local_10 + local_40)) {
        local_58 = local_50;
        local_50 = local_78;
        local_70 = node_t::node_at((node_t *)this_00,(size_t)in_RDI);
        break;
      }
    }
    bVar2 = node_t::operator==(&local_70,local_28);
    if (bVar2) goto LAB_0023e6c7;
    local_38._data = local_30._data;
    local_30._data = local_28._data;
    local_28._data = local_70._data;
  }
  local_40 = local_18;
LAB_0023e6c7:
  match_result_t::match_result_t
            (in_RDI,local_40,local_48,local_50,local_58,local_28,local_30,local_38);
  return this_00;
}

Assistant:

match_result_t zmq::radix_tree_t::match (const unsigned char *key_,
                                         size_t key_size_,
                                         bool is_lookup_ = false) const
{
    zmq_assert (key_);

    // Node we're currently at in the traversal and its predecessors.
    node_t current_node = _root;
    node_t parent_node = current_node;
    node_t grandparent_node = current_node;
    // Index of the next byte to match in the key.
    size_t key_byte_index = 0;
    // Index of the next byte to match in the current node's prefix.
    size_t prefix_byte_index = 0;
    // Index of the edge from parent to current node.
    size_t edge_index = 0;
    // Index of the edge from grandparent to parent.
    size_t parent_edge_index = 0;

    while (current_node.prefix_length () > 0 || current_node.edgecount () > 0) {
        const unsigned char *const prefix = current_node.prefix ();
        const size_t prefix_length = current_node.prefix_length ();

        for (prefix_byte_index = 0;
             prefix_byte_index < prefix_length && key_byte_index < key_size_;
             ++prefix_byte_index, ++key_byte_index) {
            if (prefix[prefix_byte_index] != key_[key_byte_index])
                break;
        }

        // Even if a prefix of the key matches and we're doing a
        // lookup, this means we've found a matching subscription.
        if (is_lookup_ && prefix_byte_index == prefix_length
            && current_node.refcount () > 0) {
            key_byte_index = key_size_;
            break;
        }

        // There was a mismatch or we've matched the whole key, so
        // there's nothing more to do.
        if (prefix_byte_index != prefix_length || key_byte_index == key_size_)
            break;

        // We need to match the rest of the key. Check if there's an
        // outgoing edge from this node.
        node_t next_node = current_node;
        for (size_t i = 0, edgecount = current_node.edgecount (); i < edgecount;
             ++i) {
            if (current_node.first_byte_at (i) == key_[key_byte_index]) {
                parent_edge_index = edge_index;
                edge_index = i;
                next_node = current_node.node_at (i);
                break;
            }
        }

        if (next_node == current_node)
            break; // No outgoing edge.
        grandparent_node = parent_node;
        parent_node = current_node;
        current_node = next_node;
    }

    return match_result_t (key_byte_index, prefix_byte_index, edge_index,
                           parent_edge_index, current_node, parent_node,
                           grandparent_node);
}